

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-shape.cpp
# Opt level: O2

Comparison __thiscall
wasm::anon_unknown_0::
RecGroupComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:329:35)>
::compare(RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:329:35)>
          *this,Type a,Type b)

{
  pointer pTVar1;
  byte bVar2;
  BasicType BVar3;
  BasicType BVar4;
  Comparison CVar5;
  Tuple *pTVar6;
  Tuple *pTVar7;
  ulong uVar8;
  HeapType a_00;
  HeapType b_00;
  bool bVar9;
  ulong uVar10;
  Type local_38;
  Type a_local;
  Type b_local;
  
  if (a.id < 7 == b.id < 7) {
    local_38.id = a.id;
    a_local = b;
    if (a.id < 7) {
      BVar3 = wasm::Type::getBasic(&local_38);
      BVar4 = wasm::Type::getBasic(&a_local);
      if (BVar3 == BVar4) {
        return EQ;
      }
      BVar3 = wasm::Type::getBasic(&local_38);
      BVar4 = wasm::Type::getBasic(&a_local);
      bVar9 = BVar3 < BVar4;
LAB_00d02c11:
      return GT - bVar9;
    }
    bVar2 = (byte)b.id & 6 < b.id;
    if (((byte)a.id & 1) == bVar2) {
      if ((a.id & 1) != 0) {
        pTVar6 = wasm::Type::getTuple(&local_38);
        pTVar7 = wasm::Type::getTuple(&a_local);
        uVar8 = (long)(pTVar6->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pTVar6->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        uVar10 = (long)(pTVar7->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(pTVar7->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl
                       .super__Vector_impl_data._M_start >> 3;
        bVar9 = uVar8 < uVar10;
        if (uVar8 == uVar10) {
          uVar8 = 0;
          do {
            pTVar1 = (pTVar6->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(pTVar6->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3) <=
                uVar8) {
              return EQ;
            }
            CVar5 = compare(this,(Type)pTVar1[uVar8].id,
                            (Type)(pTVar7->
                                  super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
                                  _M_impl.super__Vector_impl_data._M_start[uVar8].id);
            uVar8 = uVar8 + 1;
          } while (CVar5 == EQ);
          return CVar5;
        }
        goto LAB_00d02c11;
      }
      if ((b.id < 7) || ((b.id & 1) != 0)) {
        __assert_fail("a.isRef() && b.isRef()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp"
                      ,0x95,
                      "Comparison wasm::(anonymous namespace)::RecGroupComparator<(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:329:35)>::compare(Type, Type) [CompareTypes = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:329:35)]"
                     );
      }
      if ((char)(((uint)a.id & 2) >> 1) == (char)(((uint)b.id & 2) >> 1)) {
        a_00 = wasm::Type::getHeapType(&local_38);
        b_00 = wasm::Type::getHeapType(&a_local);
        CVar5 = compare(this,a_00,b_00);
        return CVar5;
      }
      bVar9 = (bool)((a.id & 2) == 0 & (byte)(b.id >> 1) & 0x7f);
    }
    else {
      bVar9 = (bool)(bVar2 & (a.id & 1) == 0);
    }
  }
  else {
    bVar9 = a.id < 7 && 6 < b.id;
  }
  return GT - bVar9;
}

Assistant:

Comparison compare(Type a, Type b) {
    if (a.isBasic() != b.isBasic()) {
      return b.isBasic() < a.isBasic() ? LT : GT;
    }
    if (a.isBasic()) {
      if (a.getBasic() != b.getBasic()) {
        return a.getBasic() < b.getBasic() ? LT : GT;
      }
      return EQ;
    }
    if (a.isTuple() != b.isTuple()) {
      return a.isTuple() < b.isTuple() ? LT : GT;
    }
    if (a.isTuple()) {
      return compare(a.getTuple(), b.getTuple());
    }
    assert(a.isRef() && b.isRef());
    if (a.isNullable() != b.isNullable()) {
      return a.isNullable() < b.isNullable() ? LT : GT;
    }
    return compare(a.getHeapType(), b.getHeapType());
  }